

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall PowerPos<0,_0,_0>::propagate_x(PowerPos<0,_0,_0> *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  ulong uVar5;
  long lVar6;
  IntVar *pIVar7;
  IntVar *pIVar8;
  IntVar *pIVar9;
  int64_t m_v;
  long lVar10;
  long lVar11;
  double dVar12;
  
  dVar12 = pow((double)(((this->z).var)->min).v,1.0 / (double)(((this->y).var)->max).v);
  dVar12 = ceil(dVar12);
  lVar6 = (long)dVar12;
  pIVar7 = (this->x).var;
  pIVar9 = (this->y).var;
  lVar11 = (long)(pIVar7->min).v;
  pIVar8 = (this->z).var;
  if (lVar11 < lVar6) {
    iVar2 = (pIVar8->min).v;
    iVar4 = my_pow(lVar6 + -1,(long)(pIVar9->max).v);
    lVar10 = lVar6 + -1;
    if (iVar4 < iVar2) {
      lVar10 = lVar6;
    }
    if (lVar10 <= lVar11) goto LAB_0018b51e;
    if (so.lazy == true) {
      iVar2 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[8])(pIVar8);
      uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
      pIVar7 = (this->x).var;
    }
    else {
      uVar5 = 0;
    }
    iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])(pIVar7,lVar10,uVar5,1);
    if ((char)iVar2 != '\0') {
      pIVar9 = (this->y).var;
      pIVar8 = (this->z).var;
      goto LAB_0018b51e;
    }
LAB_0018b5de:
    bVar1 = false;
  }
  else {
LAB_0018b51e:
    dVar12 = pow((double)(pIVar8->max).v,1.0 / (double)(pIVar9->min).v);
    dVar12 = floor(dVar12);
    lVar11 = (long)dVar12;
    pIVar9 = (this->x).var;
    lVar6 = (long)(pIVar9->max).v;
    if (lVar6 <= lVar11) {
      return true;
    }
    pIVar8 = (this->z).var;
    iVar2 = (pIVar8->max).v;
    iVar4 = my_pow(lVar11 + 1,(long)(((this->y).var)->min).v);
    lVar10 = lVar11 + 1;
    if (iVar2 < iVar4) {
      lVar10 = lVar11;
    }
    if (lVar10 < lVar6) {
      if (so.lazy == true) {
        iVar2 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[9])();
        uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar5 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
        pIVar9 = (this->x).var;
      }
      else {
        uVar5 = 0;
      }
      iVar2 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])(pIVar9,lVar10,uVar5,1);
      if ((char)iVar2 == '\0') goto LAB_0018b5de;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool propagate_x() {
		// Propagation on the lower bound
		double pow_res;
		pow_res = pow(z.getMin(), 1 / (double)y.getMax());
		int64_t x_min_new = static_cast<int64_t>(ceil(pow_res));
		if (x_min_new > x.getMin()) {
			// Check for numerical errors and correct them
			if (z.getMin() <= my_pow(x_min_new - 1, y.getMax())) {
				x_min_new--;
			}
			setDom(x, setMin, x_min_new, z.getMinLit(), y.getMaxLit());
		}
		// Propagation on the upper bound
		pow_res = pow(z.getMax(), 1 / (double)y.getMin());
		int64_t x_max_new = static_cast<int64_t>(floor(pow_res));
		if (x_max_new < x.getMax()) {
			// Check for numerical errors and correct them
			if (z.getMax() >= my_pow(x_max_new + 1, y.getMin())) {
				x_max_new++;
			}
			setDom(x, setMax, x_max_new, z.getMaxLit(), y.getMinLit());
		}
		return true;
	}